

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopCreateAnd2(Mem_Flex_t *pMan,int fCompl0,int fCompl1)

{
  char *pcVar1;
  char local_1e;
  char local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  int iStack_18;
  char Buffer [6];
  int fCompl1_local;
  int fCompl0_local;
  Mem_Flex_t *pMan_local;
  
  local_1e = '1' - (char)fCompl0;
  local_1d = '1' - (char)fCompl1;
  local_1c = 0x20;
  local_1b = 0x31;
  local_1a = 10;
  local_19 = 0;
  iStack_18 = fCompl1;
  Buffer._2_4_ = fCompl0;
  pcVar1 = Abc_SopRegister(pMan,&local_1e);
  return pcVar1;
}

Assistant:

char * Abc_SopCreateAnd2( Mem_Flex_t * pMan, int fCompl0, int fCompl1 )
{
    char Buffer[6];
    Buffer[0] = '1' - fCompl0;
    Buffer[1] = '1' - fCompl1;
    Buffer[2] = ' ';
    Buffer[3] = '1';
    Buffer[4] = '\n';
    Buffer[5] = 0;
    return Abc_SopRegister( pMan, Buffer );
}